

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkFromDar(Abc_Ntk_t *pNtkOld,Aig_Man_t *pMan)

{
  void *pvVar1;
  void *pvVar2;
  ulong uVar3;
  int iVar4;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *pAVar5;
  long lVar6;
  Vec_Ptr_t *pVVar7;
  ulong uVar8;
  ulong uVar9;
  Abc_Obj_t *p1;
  Abc_Ntk_t *pAVar10;
  
  if (pMan->nAsserts != 0) {
    __assert_fail("pMan->nAsserts == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                  ,0x1a5,"Abc_Ntk_t *Abc_NtkFromDar(Abc_Ntk_t *, Aig_Man_t *)");
  }
  pNtk = Abc_NtkStartFrom(pNtkOld,ABC_NTK_STRASH,ABC_FUNC_AIG);
  pNtk->nConstrs = pMan->nConstrs;
  pNtk->nBarBufs = pNtkOld->nBarBufs;
  pAVar5 = Abc_AigConst1(pNtk);
  (pMan->pConst1->field_5).pData = pAVar5;
  pVVar7 = pMan->vCis;
  if (0 < pVVar7->nSize) {
    lVar6 = 0;
    do {
      if (pNtk->vCis->nSize <= lVar6) goto LAB_00246502;
      pvVar1 = pVVar7->pArray[lVar6];
      pvVar2 = pNtk->vCis->pArray[lVar6];
      *(void **)((long)pvVar1 + 0x28) = pvVar2;
      *(uint *)((long)pvVar2 + 0x14) =
           *(uint *)((long)pvVar2 + 0x14) & 0xfff |
           (uint)(*(ulong *)((long)pvVar1 + 0x18) >> 0x14) & 0xfffff000;
      lVar6 = lVar6 + 1;
      pVVar7 = pMan->vCis;
    } while (lVar6 < pVVar7->nSize);
  }
  pVVar7 = Aig_ManDfs(pMan,1);
  if (0 < pVVar7->nSize) {
    lVar6 = 0;
    do {
      pvVar1 = pVVar7->pArray[lVar6];
      if ((*(uint *)((long)pvVar1 + 0x18) & 7) == 4) {
        if (((ulong)pvVar1 & 1) != 0) goto LAB_00246521;
        uVar8 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
        if (uVar8 == 0) {
          pAVar5 = (Abc_Obj_t *)0x0;
        }
        else {
          pAVar5 = (Abc_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar8 + 0x28));
        }
      }
      else {
        if (((ulong)pvVar1 & 1) != 0) goto LAB_00246521;
        uVar8 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
        if (uVar8 == 0) {
          pAVar5 = (Abc_Obj_t *)0x0;
        }
        else {
          pAVar5 = (Abc_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar8 + 0x28));
        }
        uVar8 = *(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe;
        if (uVar8 == 0) {
          p1 = (Abc_Obj_t *)0x0;
        }
        else {
          p1 = (Abc_Obj_t *)
               ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^ *(ulong *)(uVar8 + 0x28));
        }
        pAVar5 = Abc_AigAnd((Abc_Aig_t *)pNtk->pManFunc,pAVar5,p1);
      }
      *(Abc_Obj_t **)((long)pvVar1 + 0x28) = pAVar5;
      lVar6 = lVar6 + 1;
    } while (lVar6 < pVVar7->nSize);
  }
  if (pVVar7->pArray != (void **)0x0) {
    free(pVVar7->pArray);
    pVVar7->pArray = (void **)0x0;
  }
  if (pVVar7 != (Vec_Ptr_t *)0x0) {
    free(pVVar7);
  }
  pVVar7 = pMan->vCos;
  if (0 < pVVar7->nSize) {
    uVar8 = 0;
    do {
      if ((pMan->nAsserts != 0) && (uVar8 == (uint)(pMan->nObjs[3] - pMan->nAsserts))) break;
      if ((long)pNtk->vCos->nSize <= (long)uVar8) {
LAB_00246502:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if (((ulong)pVVar7->pArray[uVar8] & 1) != 0) {
LAB_00246521:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar3 = *(ulong *)((long)pVVar7->pArray[uVar8] + 8);
      uVar9 = uVar3 & 0xfffffffffffffffe;
      if (uVar9 == 0) {
        pAVar5 = (Abc_Obj_t *)0x0;
      }
      else {
        pAVar5 = (Abc_Obj_t *)((ulong)((uint)uVar3 & 1) ^ *(ulong *)(uVar9 + 0x28));
      }
      Abc_ObjAddFanin((Abc_Obj_t *)pNtk->vCos->pArray[uVar8],pAVar5);
      uVar8 = uVar8 + 1;
      pVVar7 = pMan->vCos;
    } while ((long)uVar8 < (long)pVVar7->nSize);
  }
  pAVar10 = pNtk;
  iVar4 = Abc_NtkCheck(pNtk);
  if (iVar4 == 0) {
    Abc_Print((int)pAVar10,"Abc_NtkFromDar(): Network check has failed.\n");
  }
  return pNtk;
}

Assistant:

Abc_Ntk_t * Abc_NtkFromDar( Abc_Ntk_t * pNtkOld, Aig_Man_t * pMan )
{
    Vec_Ptr_t * vNodes;
    Abc_Ntk_t * pNtkNew;
    Aig_Obj_t * pObj;
    int i;
    assert( pMan->nAsserts == 0 );
//    assert( Aig_ManRegNum(pMan) == Abc_NtkLatchNum(pNtkOld) );
    // perform strashing
    pNtkNew = Abc_NtkStartFrom( pNtkOld, ABC_NTK_STRASH, ABC_FUNC_AIG );
    pNtkNew->nConstrs = pMan->nConstrs;
    pNtkNew->nBarBufs = pNtkOld->nBarBufs;
    // transfer the pointers to the basic nodes
    Aig_ManConst1(pMan)->pData = Abc_AigConst1(pNtkNew);
    Aig_ManForEachCi( pMan, pObj, i )
    {
        pObj->pData = Abc_NtkCi(pNtkNew, i);
        // initialize logic level of the CIs
        ((Abc_Obj_t *)pObj->pData)->Level = pObj->Level;
    }
    // rebuild the AIG
    vNodes = Aig_ManDfs( pMan, 1 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        if ( Aig_ObjIsBuf(pObj) )
            pObj->pData = (Abc_Obj_t *)Aig_ObjChild0Copy(pObj);
        else
            pObj->pData = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, (Abc_Obj_t *)Aig_ObjChild0Copy(pObj), (Abc_Obj_t *)Aig_ObjChild1Copy(pObj) );
    Vec_PtrFree( vNodes );
    // connect the PO nodes
    Aig_ManForEachCo( pMan, pObj, i )
    {
        if ( pMan->nAsserts && i == Aig_ManCoNum(pMan) - pMan->nAsserts )
            break;
        Abc_ObjAddFanin( Abc_NtkCo(pNtkNew, i), (Abc_Obj_t *)Aig_ObjChild0Copy(pObj) );
    }
    // if there are assertions, add them
    if ( !Abc_NtkCheck( pNtkNew ) )
        Abc_Print( 1, "Abc_NtkFromDar(): Network check has failed.\n" );
//Abc_NtkPrintCiLevels( pNtkNew );
    return pNtkNew;
}